

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapl-configure.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  raplcap_zone zone;
  uint die;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  rapl_configure_ctx ctx;
  raplcap_limit ls;
  raplcap_limit ll;
  rapl_configure_ctx local_108;
  double local_a0;
  raplcap_limit local_98;
  raplcap_limit local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  raplcap_limit local_48;
  
  local_108.set_constraint = 0;
  local_108._84_4_ = 0;
  local_108.limit_constraint.seconds = 0.0;
  local_108.limit_short.seconds = 0.0;
  local_108.limit_short.watts = 0.0;
  local_108.limit_long.watts = 0.0;
  local_108.set_short = 0;
  local_108._60_4_ = 0;
  local_108.set_long = 0;
  local_108._36_4_ = 0;
  local_108.limit_long.seconds = 0.0;
  local_108.pkg = 0;
  local_108.die = 0;
  local_108.enabled = 0;
  local_108.set_enabled = 0;
  local_108.get_packages = 0;
  local_108.get_die = 0;
  local_108.zone = RAPLCAP_ZONE_PACKAGE;
  local_108.constraint = RAPLCAP_CONSTRAINT_LONG_TERM;
  local_108.limit_constraint.watts = 0.0;
  prog = *argv;
LAB_001031a8:
  while (iVar6 = getopt_long(argc,argv,"nNc:d:z:l:t:p:e:s:w:S:W:C:Lh",long_options,0),
        pcVar10 = _optarg, iVar6 < 0x57) {
    if (iVar6 != 0x4e) {
      if (iVar6 == 0x53) {
        local_108.limit_short.seconds = atof(_optarg);
        if (local_108.limit_short.seconds <= 0.0) {
          main_cold_2();
          goto switchD_001031d0_caseD_68;
        }
        goto LAB_0010323d;
      }
      if (iVar6 != -1) goto switchD_001031d0_caseD_66;
      if (local_108.get_packages != 0) {
        uVar7 = raplcap_get_num_packages((raplcap *)0x0);
        if (uVar7 != 0) {
LAB_001034b6:
          printf("%u\n",(ulong)uVar7);
          return 0;
        }
        pcVar10 = "Failed to get number of packages";
LAB_0010383d:
        perror(pcVar10);
        return 1;
      }
      if (local_108.get_die != 0) {
        uVar7 = raplcap_get_num_die((raplcap *)0x0,local_108.pkg);
        if (uVar7 != 0) goto LAB_001034b6;
        pcVar10 = "Failed to get number of die";
        goto LAB_0010383d;
      }
      bVar3 = local_108.set_long == 0;
      bVar4 = local_108.set_enabled == 0;
      bVar2 = local_108.set_short == 0;
      bVar1 = local_108.set_constraint == 0;
      if (((bVar3 && bVar4) && bVar2) && bVar1) {
        setenv("RAPLCAP_READ_ONLY","1",0);
      }
      iVar6 = raplcap_init((raplcap *)0x0);
      if (iVar6 != 0) {
        pcVar10 = "Failed to initialize";
        goto LAB_0010383d;
      }
      iVar8 = 0;
      iVar6 = raplcap_pd_is_zone_supported
                        ((raplcap *)0x0,local_108.pkg,local_108.die,local_108.zone);
      if (iVar6 < 0) {
        main_cold_8();
        bVar5 = true;
      }
      else {
        bVar5 = true;
        if (iVar6 == 0) {
          main_cold_7();
          iVar8 = -1;
          bVar5 = false;
        }
      }
      die = local_108.die;
      uVar7 = local_108.pkg;
      zone = local_108.zone;
      if (!bVar5) goto LAB_001038b4;
      if (((bVar3 && bVar4) && bVar2) && bVar1) {
        local_88.seconds = 0.0;
        local_88.watts = 0.0;
        local_98.seconds = 0.0;
        local_98.watts = 0.0;
        local_48.seconds = 0.0;
        local_48.watts = 0.0;
        iVar6 = raplcap_pd_is_zone_enabled
                          ((raplcap *)0x0,local_108.pkg,local_108.die,local_108.zone);
        if (iVar6 < 0) {
          main_cold_14();
        }
        iVar8 = raplcap_pd_get_limits((raplcap *)0x0,uVar7,die,zone,&local_88,&local_98);
        if (iVar8 == 0) {
          iVar8 = raplcap_pd_is_constraint_supported
                            ((raplcap *)0x0,uVar7,die,zone,RAPLCAP_CONSTRAINT_PEAK_POWER);
          if (iVar8 < 0) {
            main_cold_15();
          }
          else if ((iVar8 != 0) &&
                  (iVar8 = raplcap_pd_get_limit
                                     ((raplcap *)0x0,uVar7,die,zone,RAPLCAP_CONSTRAINT_PEAK_POWER,
                                      &local_48), iVar8 != 0)) {
            pcVar10 = "Failed to get peak power limit";
            goto LAB_001038e4;
          }
          local_58 = raplcap_pd_get_energy_counter((raplcap *)0x0,uVar7,die,zone);
          local_50 = raplcap_pd_get_energy_counter_max((raplcap *)0x0,uVar7,die,zone);
          local_68 = local_88.seconds;
          local_70 = local_88.watts;
          local_a0 = local_98.seconds;
          local_78 = local_98.watts;
          pcVar10 = "true";
          if (iVar6 == 0) {
            pcVar10 = "false";
          }
          local_60 = local_48.watts;
          pcVar9 = "unknown";
          if (-1 < iVar6) {
            pcVar9 = pcVar10;
          }
          printf("%13s: %s\n","enabled",pcVar9);
          printf("%13s: %.12f\n",local_70,"watts_long");
          printf("%13s: %.12f\n",local_68,"seconds_long");
          if (0.0 < local_a0) {
            printf("%13s: %.12f\n",local_78,"watts_short");
            printf("%13s: %.12f\n",local_a0,"seconds_short");
          }
          if (0.0 < local_60) {
            printf("%13s: %.12f\n","watts_peak");
          }
          if (0.0 <= local_58) {
            printf("%13s: %.12f\n","joules");
          }
          iVar8 = 0;
          if (0.0 <= local_50) {
            printf("%13s: %.12f\n","joules_max");
          }
        }
        else {
          pcVar10 = "Failed to get limits";
LAB_001038e4:
          perror(pcVar10);
        }
        goto LAB_001038b4;
      }
      iVar6 = raplcap_pd_is_constraint_supported
                        ((raplcap *)0x0,local_108.pkg,local_108.die,local_108.zone,
                         local_108.constraint);
      if (iVar6 < 0) {
        main_cold_10();
LAB_001037d4:
        if ((local_108.constraint == RAPLCAP_CONSTRAINT_PEAK_POWER) &&
           (0.0 < local_108.limit_constraint.seconds)) {
          main_cold_13();
          goto LAB_0010389e;
        }
        bVar1 = true;
        if (local_108.set_short == 0) {
          iVar8 = 0;
        }
        else {
          iVar8 = 0;
          iVar6 = raplcap_pd_is_constraint_supported
                            ((raplcap *)0x0,local_108.pkg,local_108.die,local_108.zone,
                             RAPLCAP_CONSTRAINT_SHORT_TERM);
          if (iVar6 < 0) {
            main_cold_12();
          }
          else if (iVar6 == 0) {
            main_cold_11();
            goto LAB_0010389e;
          }
        }
      }
      else {
        if (iVar6 != 0) goto LAB_001037d4;
        main_cold_9();
LAB_0010389e:
        iVar8 = -1;
        bVar1 = false;
      }
      if (bVar1) {
        iVar8 = configure_limits(&local_108);
      }
LAB_001038b4:
      iVar6 = raplcap_destroy((raplcap *)0x0);
      if (iVar6 == 0) {
        return iVar8;
      }
      perror("Failed to clean up");
      return iVar8;
    }
    local_108.get_die = 1;
  }
  switch(iVar6) {
  case 99:
    local_108.pkg = atoi(_optarg);
    goto LAB_001031a8;
  case 100:
    local_108.die = atoi(_optarg);
    goto LAB_001031a8;
  case 0x65:
    local_108.enabled = atoi(_optarg);
    local_108.set_enabled = 1;
    goto LAB_001031a8;
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x75:
  case 0x76:
  case 0x78:
  case 0x79:
    break;
  case 0x68:
switchD_001031d0_caseD_68:
    print_usage(0);
  case 0x6c:
    iVar6 = strcmp(_optarg,"LONG");
    if (iVar6 == 0) {
      local_108.constraint = RAPLCAP_CONSTRAINT_LONG_TERM;
      goto LAB_001031a8;
    }
    iVar6 = strcmp(pcVar10,"SHORT");
    if (iVar6 == 0) {
      local_108.constraint = RAPLCAP_CONSTRAINT_SHORT_TERM;
      goto LAB_001031a8;
    }
    iVar6 = strcmp(pcVar10,"PEAK");
    if (iVar6 == 0) {
      local_108.constraint = RAPLCAP_CONSTRAINT_PEAK_POWER;
      goto LAB_001031a8;
    }
    break;
  case 0x6e:
    local_108.get_packages = 1;
    goto LAB_001031a8;
  case 0x70:
    local_108.limit_constraint.watts = atof(_optarg);
    if (0.0 < local_108.limit_constraint.watts) goto LAB_001032e2;
    goto LAB_00103906;
  case 0x73:
    local_108.limit_long.seconds = atof(_optarg);
    if (local_108.limit_long.seconds <= 0.0) goto LAB_0010390b;
LAB_00103362:
    local_108.set_long = 1;
    goto LAB_001031a8;
  case 0x74:
    local_108.limit_constraint.seconds = atof(_optarg);
    if (local_108.limit_constraint.seconds <= 0.0) goto LAB_00103915;
LAB_001032e2:
    local_108.set_constraint = 1;
    goto LAB_001031a8;
  case 0x77:
    local_108.limit_long.watts = atof(_optarg);
    if (0.0 < local_108.limit_long.watts) goto LAB_00103362;
    main_cold_3();
LAB_00103906:
    main_cold_5();
LAB_0010390b:
    main_cold_4();
LAB_00103910:
    main_cold_1();
LAB_00103915:
    main_cold_6();
  case 0x7a:
    iVar6 = strcmp(_optarg,"PACKAGE");
    if (iVar6 == 0) {
      local_108.zone = RAPLCAP_ZONE_PACKAGE;
      goto LAB_001031a8;
    }
    iVar6 = strcmp(pcVar10,"CORE");
    if (iVar6 == 0) {
      local_108.zone = RAPLCAP_ZONE_CORE;
      goto LAB_001031a8;
    }
    iVar6 = strcmp(pcVar10,"UNCORE");
    if (iVar6 == 0) {
      local_108.zone = RAPLCAP_ZONE_UNCORE;
      goto LAB_001031a8;
    }
    iVar6 = strcmp(pcVar10,"DRAM");
    if (iVar6 == 0) {
      local_108.zone = RAPLCAP_ZONE_DRAM;
      goto LAB_001031a8;
    }
    iVar6 = strcmp(pcVar10,"PSYS");
    if (iVar6 == 0) {
      local_108.zone = RAPLCAP_ZONE_PSYS;
      goto LAB_001031a8;
    }
    break;
  default:
    if (iVar6 != 0x57) break;
    local_108.limit_short.watts = atof(_optarg);
    if (local_108.limit_short.watts <= 0.0) goto LAB_00103910;
LAB_0010323d:
    local_108.set_short = 1;
    goto LAB_001031a8;
  }
switchD_001031d0_caseD_66:
  print_usage(1);
}

Assistant:

int main(int argc, char** argv) {
  rapl_configure_ctx ctx = { 0 };
  int ret = 0;
  int c;
  uint32_t count;
  prog = argv[0];
  int is_read_only;

  // parse parameters
  while ((c = getopt_long(argc, argv, short_options, long_options, NULL)) != -1) {
    switch (c) {
      case 'h':
        print_usage(0);
        break;
      case 'c':
        ctx.pkg = (unsigned int) atoi(optarg);
        break;
      case 'd':
        ctx.die = (unsigned int) atoi(optarg);
        break;
      case 'n':
        ctx.get_packages = 1;
        break;
      case 'N':
        ctx.get_die = 1;
        break;
      case 'z':
        if (!strcmp(optarg, "PACKAGE")) {
          ctx.zone = RAPLCAP_ZONE_PACKAGE;
        } else if (!strcmp(optarg, "CORE")) {
          ctx.zone = RAPLCAP_ZONE_CORE;
        } else if (!strcmp(optarg, "UNCORE")) {
          ctx.zone = RAPLCAP_ZONE_UNCORE;
        } else if (!strcmp(optarg, "DRAM")) {
          ctx.zone = RAPLCAP_ZONE_DRAM;
        } else if (!strcmp(optarg, "PSYS")) {
          ctx.zone = RAPLCAP_ZONE_PSYS;
        } else {
          print_usage(1);
        }
        break;
      case 'l':
        if (!strcmp(optarg, "LONG")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_LONG_TERM;
        } else if (!strcmp(optarg, "SHORT")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_SHORT_TERM;
        } else if (!strcmp(optarg, "PEAK")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_PEAK_POWER;
        } else {
          print_usage(1);
        }
        break;
      case 't':
        SET_VAL(optarg, ctx.limit_constraint.seconds, ctx.set_constraint);
        break;
      case 'p':
        SET_VAL(optarg, ctx.limit_constraint.watts, ctx.set_constraint);
        break;
      case 'e':
        ctx.enabled = atoi(optarg);
        ctx.set_enabled = 1;
        break;
      case 's':
        SET_VAL(optarg, ctx.limit_long.seconds, ctx.set_long);
        break;
      case 'w':
        SET_VAL(optarg, ctx.limit_long.watts, ctx.set_long);
        break;
      case 'S':
        SET_VAL(optarg, ctx.limit_short.seconds, ctx.set_short);
        break;
      case 'W':
        SET_VAL(optarg, ctx.limit_short.watts, ctx.set_short);
        break;
#ifdef RAPLCAP_msr
      case 'C':
        ctx.clamped = atoi(optarg);
        ctx.set_clamped = 1;
        break;
      case 'L':
        ctx.set_locked = 1;
        break;
#endif // RAPLCAP_msr
      case '?':
      default:
        print_usage(1);
        break;
    }
  }

  // just print the number of packages or die and exit
  // these are often unprivileged operations since we don't need to initialize a raplcap instance
  if (ctx.get_packages) {
    count = raplcap_get_num_packages(NULL);
    if (count == 0) {
      perror("Failed to get number of packages");
      return 1;
    }
    printf("%"PRIu32"\n", count);
    return 0;
  }
  if (ctx.get_die) {
    count = raplcap_get_num_die(NULL, ctx.pkg);
    if (count == 0) {
      perror("Failed to get number of die");
      return 1;
    }
    printf("%"PRIu32"\n", count);
    return 0;
  }

  // initialize
  is_read_only = !ctx.set_enabled && !ctx.set_long && !ctx.set_short && !ctx.set_constraint;
#ifdef RAPLCAP_msr
  is_read_only &= !ctx.set_clamped && !ctx.set_locked;
#endif // RAPLCAP_msr
#ifndef _WIN32
  if (is_read_only) {
    // request read-only access (not supported by all implementations, therefore not guaranteed)
    setenv(ENV_RAPLCAP_READ_ONLY, "1", 0);
  }
#endif
  if (raplcap_init(NULL)) {
    perror("Failed to initialize");
    return 1;
  }

  if (!(ret = check_zone_supported(&ctx))) {
    // perform requested action
    if (is_read_only) {
      // TODO: Should we limit output by constraint, too?
      ret = get_limits(ctx.pkg, ctx.die, ctx.zone);
    } else if (!(ret = check_constraint_supported(&ctx))) {
      ret = configure_limits(&ctx);
    }
  }

  // cleanup
  if (raplcap_destroy(NULL)) {
    perror("Failed to clean up");
  }

  return ret;
}